

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_luma_horz
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 UVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  UWORD8 *pUVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 in_XMM1 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar32 [16];
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM13 [16];
  undefined1 in_XMM14 [16];
  undefined1 in_XMM15 [16];
  
  if (nt == 0x20) {
    pauVar17 = (undefined1 (*) [16])(pu1_dst + 0x10);
    lVar19 = 0x20;
    do {
      auVar27 = pshufb(ZEXT116(pu1_ref[lVar19 + ((ulong)(uint)(nt * 2) - 0x21)]),
                       (undefined1  [16])0x0);
      pauVar17[-1] = auVar27;
      *pauVar17 = auVar27;
      pauVar17 = (undefined1 (*) [16])(*pauVar17 + dst_strd);
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  else if (0 < nt) {
    uVar20 = (ulong)(uint)(nt * 2);
    uVar16 = (ulong)(uint)nt;
    uVar21 = 0;
    do {
      iVar23 = ((int)((uint)pu1_ref[uVar21 + uVar20 + 1] - (uint)pu1_ref[uVar20]) >> 1) +
               (uint)pu1_ref[uVar20 - 1];
      if ((short)iVar23 < 1) {
        iVar23 = 0;
      }
      if (0xfe < (short)iVar23) {
        iVar23 = 0xff;
      }
      pu1_dst[uVar21] = (UWORD8)iVar23;
      auVar27 = _DAT_001721d0;
      uVar21 = uVar21 + 1;
    } while (uVar16 != uVar21);
    if (nt != 1) {
      lVar19 = uVar16 - 1;
      pUVar18 = pu1_dst + (long)dst_strd + 0xf;
      uVar21 = 1;
      auVar28 = pmovsxbq(in_XMM6,0x100);
      auVar32 = pmovsxbq(in_XMM11,0x1010);
      do {
        UVar1 = pu1_ref[~uVar21 + uVar20];
        uVar22 = 0;
        in_XMM13 = pmovsxbq(in_XMM13,0x302);
        in_XMM14 = pmovsxbq(in_XMM14,0x504);
        in_XMM15 = pmovsxbq(in_XMM15,0x706);
        in_XMM4 = pmovsxbq(in_XMM4,0x908);
        in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
        in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
        in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
        auVar31 = auVar28;
        do {
          auVar25._8_4_ = (int)lVar19;
          auVar25._0_8_ = lVar19;
          auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
          auVar25 = auVar25 ^ auVar27;
          lVar24 = auVar25._0_8_;
          auVar34._0_8_ = -(ulong)(lVar24 < SUB168(auVar31 ^ auVar27,0));
          lVar26 = auVar25._8_8_;
          auVar34._8_8_ = -(ulong)(lVar26 < SUB168(auVar31 ^ auVar27,8));
          auVar29 = pshuflw(in_XMM7,auVar34,0xe8);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar29 ^ auVar30,auVar29 ^ auVar30);
          if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 0xf] = UVar1;
          }
          auVar34 = packssdw(auVar34,auVar34);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar34 ^ auVar29,auVar34 ^ auVar29);
          auVar29 = packsswb(auVar29,auVar29);
          if ((auVar29 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 0xe] = UVar1;
          }
          auVar35._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM13 ^ auVar27,0));
          auVar35._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM13 ^ auVar27,8));
          auVar30 = packssdw(auVar30,auVar35);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar2,auVar30 ^ auVar2);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 0xd] = UVar1;
          }
          auVar30 = pshufhw(auVar30,auVar35,0x84);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar3,auVar30 ^ auVar3);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 0xc] = UVar1;
          }
          auVar36._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM14 ^ auVar27,0));
          auVar36._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM14 ^ auVar27,8));
          auVar30 = pshuflw(auVar30,auVar36,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar4,auVar30 ^ auVar4);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 0xb] = UVar1;
          }
          auVar29 = packssdw(auVar36,auVar36);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30,auVar29 ^ auVar5);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 10] = UVar1;
          }
          auVar37._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM15 ^ auVar27,0));
          auVar37._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM15 ^ auVar27,8));
          auVar30 = packssdw(auVar30,auVar37);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar6,auVar30 ^ auVar6);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 9] = UVar1;
          }
          auVar30 = pshufhw(auVar30,auVar37,0x84);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar7,auVar30 ^ auVar7);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 8] = UVar1;
          }
          auVar38._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM4 ^ auVar27,0));
          auVar38._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM4 ^ auVar27,8));
          auVar30 = pshuflw(auVar30,auVar38,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar8,auVar30 ^ auVar8);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 7] = UVar1;
          }
          auVar29 = packssdw(auVar38,auVar38);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar29 = packssdw(auVar29 ^ auVar9,auVar29 ^ auVar9);
          auVar30 = packsswb(auVar30,auVar29);
          if ((auVar30 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 6] = UVar1;
          }
          auVar39._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM3 ^ auVar27,0));
          auVar39._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM3 ^ auVar27,8));
          auVar30 = packssdw(auVar30,auVar39);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar10,auVar30 ^ auVar10);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 5] = UVar1;
          }
          auVar30 = pshufhw(auVar30,auVar39,0x84);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar11,auVar30 ^ auVar11);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 4] = UVar1;
          }
          auVar40._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM2 ^ auVar27,0));
          auVar40._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM2 ^ auVar27,8));
          auVar30 = pshuflw(auVar30,auVar40,0xe8);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30 ^ auVar12,auVar30 ^ auVar12);
          auVar30 = packsswb(auVar30,auVar30);
          if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 3] = UVar1;
          }
          auVar29 = packssdw(auVar40,auVar40);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar30 = packssdw(auVar30,auVar29 ^ auVar13);
          in_XMM7 = packsswb(auVar30,auVar30);
          if ((in_XMM7 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 2] = UVar1;
          }
          auVar41._0_8_ = -(ulong)(lVar24 < SUB168(in_XMM1 ^ auVar27,0));
          auVar41._8_8_ = -(ulong)(lVar26 < SUB168(in_XMM1 ^ auVar27,8));
          auVar25 = packssdw(auVar25,auVar41);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar25 = packssdw(auVar25 ^ auVar14,auVar25 ^ auVar14);
          auVar25 = packsswb(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22 - 1] = UVar1;
          }
          auVar25 = pshufhw(auVar25,auVar41,0x84);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar25 = packssdw(auVar25 ^ auVar15,auVar25 ^ auVar15);
          auVar25 = packsswb(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            pUVar18[uVar22] = UVar1;
          }
          uVar22 = uVar22 + 0x10;
          lVar24 = auVar31._8_8_;
          lVar26 = auVar32._0_8_;
          auVar31._0_8_ = auVar31._0_8_ + lVar26;
          lVar33 = auVar32._8_8_;
          auVar31._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM13._8_8_;
          in_XMM13._0_8_ = in_XMM13._0_8_ + lVar26;
          in_XMM13._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM14._8_8_;
          in_XMM14._0_8_ = in_XMM14._0_8_ + lVar26;
          in_XMM14._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM15._8_8_;
          in_XMM15._0_8_ = in_XMM15._0_8_ + lVar26;
          in_XMM15._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM4._8_8_;
          in_XMM4._0_8_ = in_XMM4._0_8_ + lVar26;
          in_XMM4._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM3._8_8_;
          in_XMM3._0_8_ = in_XMM3._0_8_ + lVar26;
          in_XMM3._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM2._8_8_;
          in_XMM2._0_8_ = in_XMM2._0_8_ + lVar26;
          in_XMM2._8_8_ = lVar24 + lVar33;
          lVar24 = in_XMM1._8_8_;
          in_XMM1._0_8_ = in_XMM1._0_8_ + lVar26;
          in_XMM1._8_8_ = lVar24 + lVar33;
        } while ((nt + 0xfU & 0xfffffff0) != uVar22);
        uVar21 = uVar21 + 1;
        pUVar18 = pUVar18 + dst_strd;
      } while (uVar21 != uVar16);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 row, col;
    WORD32 two_nt;
    WORD16 s2_predpixel;
    UNUSED(mode);
    UNUSED(src_strd);
    two_nt = 2 * nt;

    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
    else
    {
        /*Filtering done for the 1st row */
        for(col = 0; col < nt; col++)
        {
            s2_predpixel = pu1_ref[two_nt - 1]
                            + ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1);
            pu1_dst[col] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next rows*/
        for(row = 1; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];
    }
}